

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS AddNewLineAndIndentation(JlBuffer *JsonBuffer,_Bool IndentedFormat,uint32_t Depth)

{
  size_t sVar1;
  undefined1 local_128 [8];
  char indentString [256];
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  uint32_t Depth_local;
  _Bool IndentedFormat_local;
  JlBuffer *JsonBuffer_local;
  
  if (IndentedFormat) {
    sVar1 = JlBufferGetDataSize(JsonBuffer);
    if (sVar1 == 0) {
      local_1c = JL_STATUS_SUCCESS;
    }
    else {
      local_1c = JlBufferAdd(JsonBuffer,"\n",1);
      if ((local_1c == JL_STATUS_SUCCESS) && (memset(local_128,0x20,0x100), 1 < Depth)) {
        local_1c = JlBufferAdd(JsonBuffer,local_128,(ulong)((Depth - 1) * 4));
      }
    }
  }
  else {
    local_1c = JL_STATUS_SUCCESS;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    AddNewLineAndIndentation
    (
        JlBuffer*       JsonBuffer,
        bool            IndentedFormat,
        uint32_t        Depth
    )
{
    JL_STATUS jlStatus;

    if( IndentedFormat )
    {
        if( JlBufferGetDataSize( JsonBuffer ) > 0 )
        {
            jlStatus = JlBufferAdd( JsonBuffer, "\n", 1 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                char indentString [MAX_JSON_DEPTH*4];
                memset( indentString, ' ', sizeof(indentString) );

                if( Depth > 1 )
                {
                    jlStatus = JlBufferAdd( JsonBuffer, indentString, (Depth-1)*4 );
                }
            }
        }
        else
        {
            // Suppress first newline and indent
            jlStatus = JL_STATUS_SUCCESS;
        }
    }
    else
    {
        jlStatus = JL_STATUS_SUCCESS;
    }

    return jlStatus;
}